

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable
          (ScalarReplacementPass *this,Instruction *from,Instruction *to,uint32_t member_index)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  ScalarReplacementPass *pSVar2;
  uint32_t uVar3;
  array<signed_char,_4UL> aVar4;
  uint32_t uVar5;
  Analysis AVar6;
  Instruction *pIVar7;
  Instruction *this_01;
  Operand *pOVar8;
  uint uVar9;
  pointer ppIVar10;
  undefined1 local_c8 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a0;
  uint32_t local_8c;
  Instruction *local_88;
  ScalarReplacementPass *local_80;
  pointer local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_88 = to;
  pIVar7 = GetStorageType(this,from);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_00 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar3 = 0;
  if (pIVar7->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  analysis::DecorationManager::GetDecorationsFor(&local_48,this_00,uVar3,false);
  local_78 = local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar10 = local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = member_index;
  pSVar2 = this;
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_80 = pSVar2;
      local_8c = uVar3;
      pIVar7 = *ppIVar10;
      if (pIVar7->opcode_ == OpMemberDecorate) {
        uVar9 = (pIVar7->has_result_id_ & 1) + 1;
        if (pIVar7->has_type_id_ == false) {
          uVar9 = (uint)pIVar7->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(pIVar7,uVar9 + 1);
        if (uVar3 == member_index) {
          uVar9 = (pIVar7->has_result_id_ & 1) + 1;
          if (pIVar7->has_type_id_ == false) {
            uVar9 = (uint)pIVar7->has_result_id_;
          }
          uVar3 = Instruction::GetSingleWordOperand(pIVar7,uVar9 + 2);
          if ((uVar3 < 0x30) && ((0xf00000000041U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
            this_01 = (Instruction *)operator_new(0x70);
            local_c8._0_8_ = (pointer)0x0;
            local_c8._8_8_ = (pointer)0x0;
            local_c8._16_8_ = (pointer)0x0;
            aVar4._M_elems[0] = '\0';
            aVar4._M_elems[1] = '\0';
            aVar4._M_elems[2] = '\0';
            aVar4._M_elems[3] = '\0';
            Instruction::Instruction
                      (this_01,(this->super_MemPass).super_Pass.context_,OpDecorate,0,0,
                       (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       local_c8);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       local_c8);
            if (local_88->has_result_id_ == true) {
              aVar4._M_elems =
                   (_Type)Instruction::GetSingleWordOperand(local_88,(uint)local_88->has_type_id_);
            }
            local_70._0_8_ = &PTR__SmallVector_00b02ef8;
            local_70._24_8_ = local_70 + 0x10;
            local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_70._8_8_ = 1;
            local_c8._0_4_ = 1;
            local_c8._8_8_ = &PTR__SmallVector_00b02ef8;
            local_c8._16_8_ = (pointer)0x0;
            local_c8._32_8_ = local_c8 + 0x18;
            local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_70._16_4_ = aVar4._M_elems;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
                       (SmallVector<unsigned_int,_2UL> *)local_70);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&this_01->operands_,(Operand *)local_c8);
            local_c8._8_8_ = &PTR__SmallVector_00b02ef8;
            if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )local_a0._M_head_impl !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a0,local_a0._M_head_impl);
            }
            local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_70._0_8_ = &PTR__SmallVector_00b02ef8;
            if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_50,local_50._M_head_impl);
            }
            uVar3 = Instruction::NumInOperandWords(pIVar7);
            if (2 < uVar3) {
              uVar3 = 2;
              do {
                pOVar8 = Instruction::GetInOperand(pIVar7,uVar3);
                local_c8._0_4_ = pOVar8->type;
                local_c8._8_8_ = &PTR__SmallVector_00b02ef8;
                local_c8._16_8_ = (pointer)0x0;
                local_c8._32_8_ = local_c8 + 0x18;
                local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                utils::SmallVector<unsigned_int,_2UL>::operator=
                          ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),&pOVar8->words);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                emplace_back<spvtools::opt::Operand>(&this_01->operands_,(Operand *)local_c8);
                local_c8._8_8_ = &PTR__SmallVector_00b02ef8;
                if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )local_a0._M_head_impl !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&local_a0,local_a0._M_head_impl);
                }
                uVar3 = uVar3 + 1;
                uVar5 = Instruction::NumInOperandWords(pIVar7);
              } while (uVar3 < uVar5);
            }
            this = local_80;
            pIVar1 = (local_80->super_MemPass).super_Pass.context_;
            AVar6 = pIVar1->valid_analyses_;
            if ((AVar6 & kAnalysisDecorations) != kAnalysisNone) {
              analysis::DecorationManager::AddDecoration
                        ((pIVar1->decoration_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>
                         ._M_head_impl,this_01);
              AVar6 = pIVar1->valid_analyses_;
            }
            member_index = local_8c;
            if ((AVar6 & kAnalysisBegin) != kAnalysisNone) {
              analysis::DefUseManager::AnalyzeInstDefUse
                        ((pIVar1->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,this_01);
            }
            utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                      (&(((pIVar1->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        annotations_).super_IntrusiveList<spvtools::opt::Instruction>,this_01);
          }
        }
      }
      ppIVar10 = ppIVar10 + 1;
      uVar3 = local_8c;
      pSVar2 = local_80;
    } while (ppIVar10 != local_78);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable(
    Instruction* from, Instruction* to, uint32_t member_index) {
  Instruction* type_inst = GetStorageType(from);
  for (auto dec_inst :
       get_decoration_mgr()->GetDecorationsFor(type_inst->result_id(), false)) {
    uint32_t decoration;
    if (dec_inst->opcode() == spv::Op::OpMemberDecorate) {
      if (dec_inst->GetSingleWordInOperand(1) != member_index) {
        continue;
      }

      decoration = dec_inst->GetSingleWordInOperand(2u);
      switch (spv::Decoration(decoration)) {
        case spv::Decoration::ArrayStride:
        case spv::Decoration::Alignment:
        case spv::Decoration::AlignmentId:
        case spv::Decoration::MaxByteOffset:
        case spv::Decoration::MaxByteOffsetId:
        case spv::Decoration::RelaxedPrecision: {
          std::unique_ptr<Instruction> new_dec_inst(
              new Instruction(context(), spv::Op::OpDecorate, 0, 0, {}));
          new_dec_inst->AddOperand(
              Operand(SPV_OPERAND_TYPE_ID, {to->result_id()}));
          for (uint32_t i = 2; i < dec_inst->NumInOperandWords(); ++i) {
            new_dec_inst->AddOperand(Operand(dec_inst->GetInOperand(i)));
          }
          context()->AddAnnotationInst(std::move(new_dec_inst));
        } break;
        default:
          break;
      }
    }
  }
}